

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

ON_Material *
ON_Material::FromModelComponentRef
          (ON_ModelComponentReference *model_component_reference,ON_Material *none_return_value)

{
  ON_ModelComponent *p_00;
  ON_Material *pOVar1;
  ON_Material *local_28;
  ON_Material *p;
  ON_Material *none_return_value_local;
  ON_ModelComponentReference *model_component_reference_local;
  
  p_00 = ON_ModelComponentReference::ModelComponent(model_component_reference);
  pOVar1 = Cast(&p_00->super_ON_Object);
  local_28 = none_return_value;
  if (pOVar1 != (ON_Material *)0x0) {
    local_28 = pOVar1;
  }
  return local_28;
}

Assistant:

const ON_Material* ON_Material::FromModelComponentRef(
  const class ON_ModelComponentReference& model_component_reference,
  const ON_Material* none_return_value
  )
{
  const ON_Material* p = ON_Material::Cast(model_component_reference.ModelComponent());
  return (nullptr != p) ? p : none_return_value;
}